

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testExtendByInterval<float>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  float *pfVar3;
  char *in_RDI;
  float fVar4;
  float p1_1;
  float p0_1;
  uint i;
  float max;
  float min;
  Interval<float> b_1;
  uint iters;
  Rand32 rand;
  Interval<float> b1;
  Interval<float> b0;
  float p1;
  float p0;
  Interval<float> b;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff81;
  undefined1 uVar5;
  undefined1 uVar6;
  float in_stack_ffffffffffffff84;
  Interval<float> local_70;
  float local_68;
  float local_64;
  uint local_60;
  float local_5c;
  float local_58;
  Interval<float> local_54;
  undefined4 local_4c;
  Interval<float> local_40;
  Interval<float> local_38;
  Interval<float> local_30;
  Interval<float> local_28;
  float local_20;
  float local_1c;
  Interval<float> local_18;
  Interval<float> local_10;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    extendBy() interval for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<float>::Interval((Interval<float> *)0x16cecb);
  Imath_3_2::Interval<float>::Interval((Interval<float> *)0x16ced5);
  Imath_3_2::Interval<float>::extendBy(&local_10,&local_18);
  fVar4 = std::numeric_limits<float>::max();
  bVar1 = false;
  if ((local_10.min == fVar4) && (!NAN(local_10.min) && !NAN(fVar4))) {
    fVar4 = std::numeric_limits<float>::lowest();
    bVar1 = local_10.max == fVar4;
    in_stack_ffffffffffffff84 = local_10.max;
  }
  if (!bVar1) {
    __assert_fail("b.min == T (std::numeric_limits<T>::max ()) && b.max == T (std::numeric_limits<T>::lowest ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0xde,"void (anonymous namespace)::testExtendByInterval(const char *) [T = float]"
                 );
  }
  local_1c = -1.0;
  local_20 = 1.0;
  Imath_3_2::Interval<float>::Interval((Interval<float> *)0x16cf85);
  Imath_3_2::Interval<float>::Interval(&local_30,&local_1c,&local_20);
  Imath_3_2::Interval<float>::extendBy(&local_28,&local_30);
  uVar6 = false;
  if ((local_28.min == local_1c) && (!NAN(local_28.min) && !NAN(local_1c))) {
    uVar6 = local_28.max == local_20;
  }
  if ((bool)uVar6 == false) {
    __assert_fail("b0.min == p0 && b0.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0xea,"void (anonymous namespace)::testExtendByInterval(const char *) [T = float]"
                 );
  }
  Imath_3_2::Interval<float>::Interval(&local_38,&local_1c,&local_20);
  Imath_3_2::Interval<float>::Interval((Interval<float> *)0x16d01d);
  Imath_3_2::Interval<float>::extendBy(&local_38,&local_40);
  uVar5 = false;
  if ((local_38.min == local_1c) && (!NAN(local_38.min) && !NAN(local_1c))) {
    uVar5 = local_38.max == local_20;
  }
  if ((bool)uVar5 == false) {
    __assert_fail("b1.min == p0 && b1.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0xee,"void (anonymous namespace)::testExtendByInterval(const char *) [T = float]"
                 );
  }
  Imath_3_2::Rand32::Rand32
            ((Rand32 *)
             CONCAT44(in_stack_ffffffffffffff84,
                      CONCAT13(uVar6,CONCAT12(uVar5,CONCAT11(in_stack_ffffffffffffff81,
                                                             in_stack_ffffffffffffff80)))),
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_4c = 10;
  Imath_3_2::Interval<float>::Interval((Interval<float> *)0x16d0a3);
  local_60 = 1;
  while( true ) {
    if (9 < local_60) {
      return;
    }
    local_64 = Imath_3_2::Rand32::nextf
                         ((Rand32 *)
                          CONCAT44(in_stack_ffffffffffffff84,
                                   CONCAT13(uVar6,CONCAT12(uVar5,CONCAT11(in_stack_ffffffffffffff81,
                                                                          in_stack_ffffffffffffff80)
                                                          ))),in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
    local_68 = Imath_3_2::Rand32::nextf
                         ((Rand32 *)
                          CONCAT44(in_stack_ffffffffffffff84,
                                   CONCAT13(uVar6,CONCAT12(uVar5,CONCAT11(in_stack_ffffffffffffff81,
                                                                          in_stack_ffffffffffffff80)
                                                          ))),in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
    local_58 = local_54.min;
    local_5c = local_54.max;
    pfVar3 = std::min<float>(&local_58,&local_64);
    local_58 = *pfVar3;
    pfVar3 = std::max<float>(&local_5c,&local_68);
    local_5c = *pfVar3;
    Imath_3_2::Interval<float>::Interval(&local_70,&local_64,&local_68);
    Imath_3_2::Interval<float>::extendBy(&local_54,&local_70);
    in_stack_ffffffffffffff81 = false;
    if ((local_54.min == local_58) && (!NAN(local_54.min) && !NAN(local_58))) {
      in_stack_ffffffffffffff81 = local_54.max == local_5c;
    }
    if ((bool)in_stack_ffffffffffffff81 == false) break;
    local_60 = local_60 + 1;
  }
  __assert_fail("b.min == min && b.max == max",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                ,0x107,"void (anonymous namespace)::testExtendByInterval(const char *) [T = float]")
  ;
}

Assistant:

void
testExtendByInterval (const char* type)
{
    cout << "    extendBy() interval for type " << type << endl;

    //
    // Extend empty interval with an empty interval
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        b.extendBy (IMATH_INTERNAL_NAMESPACE::Interval<T> ());
        assert (
            b.min == T (std::numeric_limits<T>::max ()) &&
            b.max == T (std::numeric_limits<T>::lowest ()));
    }

    //
    // Extend empty interval with a non-empty interval and vice versa.
    //
    {
        T p0 (-1);
        T p1 (1);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b0;
        b0.extendBy (IMATH_INTERNAL_NAMESPACE::Interval<T> (p0, p1));
        assert (b0.min == p0 && b0.max == p1);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p0, p1);
        b1.extendBy (IMATH_INTERNAL_NAMESPACE::Interval<T> ());
        assert (b1.min == p0 && b1.max == p1);
    }

    //
    // Extend non-empty interval with non-empty interval. Starts with empty, then builds.
    //
    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);
    const unsigned int               iters = 10;
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;

        T min, max;

        for (unsigned int i = 1; i < iters; i++)
        {
            T p0 (static_cast<T>(rand.nextf (0, 999)));
            T p1 (static_cast<T>(rand.nextf (1000, 1999)));

            min = b.min;
            max = b.max;
            min = std::min (min, p0);
            max = std::max (max, p1);

            b.extendBy (IMATH_INTERNAL_NAMESPACE::Interval<T> (p0, p1));

            assert (b.min == min && b.max == max);
        }
    }
}